

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::ParseSimpleStream
          (objectivec *this,ZeroCopyInputStream *input_stream,string_view stream_name,
          LineConsumer *line_consumer,string *out_error)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  string_view chunk;
  string_view chunk_00;
  undefined4 uStack_1b0;
  int buf_len;
  string *local_1a8;
  char *local_1a0;
  void *buf;
  Parser parser;
  string local_error;
  AlphaNum local_140;
  AlphaNum local_110;
  string_view local_e0 [3];
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  parser.line_consumer_ = (LineConsumer *)stream_name._M_str;
  local_1a0 = (char *)stream_name._M_len;
  local_error._M_dataplus._M_p = (pointer)&local_error.field_2;
  local_error._M_string_length = 0;
  parser.line_ = 0;
  local_error.field_2._M_local_buf[0] = '\0';
  parser.leftover_._M_dataplus._M_p = (pointer)&parser.leftover_.field_2;
  parser.leftover_._M_string_length = 0;
  parser.leftover_.field_2._M_local_buf[0] = '\0';
  local_1a8 = (string *)line_consumer;
  do {
    do {
      cVar1 = (**(code **)(*(long *)this + 0x10))(this,&buf,&buf_len);
      if (cVar1 == '\0') {
        bVar2 = true;
        if (parser.leftover_._M_string_length == 0) goto LAB_002474b8;
        chunk_00._M_str = "\n";
        chunk_00._M_len = 1;
        bVar3 = anon_unknown_0::Parser::ParseChunk(&parser,chunk_00,&local_error);
        if (bVar3) {
          if (parser.leftover_._M_string_length == 0) goto LAB_002474b8;
          std::__cxx11::string::assign((char *)&local_error);
        }
        local_e0[0] = absl::lts_20250127::NullSafeStringView("error: ");
        local_110.piece_._M_str = local_1a0;
        local_110.piece_._M_len = (size_t)input_stream;
        local_140.piece_ = absl::lts_20250127::NullSafeStringView(" Line ");
        absl::lts_20250127::AlphaNum::AlphaNum(&local_90,parser.line_);
        local_60.piece_ = absl::lts_20250127::NullSafeStringView(", ");
        absl::lts_20250127::StrCat<std::__cxx11::string>
                  (&local_b0,(lts_20250127 *)local_e0,&local_110,&local_140,&local_90,&local_60,
                   (AlphaNum *)&local_error,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(buf_len,uStack_1b0));
        goto LAB_00247499;
      }
      chunk._M_len = (size_t)buf_len;
    } while (chunk._M_len == 0);
    chunk._M_str = (char *)buf;
    bVar2 = anon_unknown_0::Parser::ParseChunk(&parser,chunk,&local_error);
  } while (bVar2);
  local_e0[0] = absl::lts_20250127::NullSafeStringView("error: ");
  local_110.piece_._M_str = local_1a0;
  local_110.piece_._M_len = (size_t)input_stream;
  local_140.piece_ = absl::lts_20250127::NullSafeStringView(" Line ");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,parser.line_);
  local_60.piece_ = absl::lts_20250127::NullSafeStringView(", ");
  absl::lts_20250127::StrCat<std::__cxx11::string>
            (&local_b0,(lts_20250127 *)local_e0,&local_110,&local_140,&local_90,&local_60,
             (AlphaNum *)&local_error,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(buf_len,uStack_1b0));
LAB_00247499:
  std::__cxx11::string::operator=(local_1a8,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar2 = false;
LAB_002474b8:
  std::__cxx11::string::~string((string *)&parser.leftover_);
  std::__cxx11::string::~string((string *)&local_error);
  return bVar2;
}

Assistant:

bool ParseSimpleStream(io::ZeroCopyInputStream& input_stream,
                       absl::string_view stream_name,
                       LineConsumer* line_consumer, std::string* out_error) {
  std::string local_error;
  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (input_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(
            absl::string_view(static_cast<const char*>(buf), (size_t)buf_len),
            &local_error)) {
      *out_error = absl::StrCat("error: ", stream_name, " Line ",
                                parser.last_line(), ", ", local_error);
      return false;
    }
  }
  if (!parser.Finish(&local_error)) {
    *out_error = absl::StrCat("error: ", stream_name, " Line ",
                              parser.last_line(), ", ", local_error);
    return false;
  }
  return true;
}